

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  FILE *__stream;
  char *pcVar6;
  int *piVar7;
  undefined8 extraout_RAX;
  string *this;
  string *__s;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  FlagSaver fs;
  string filename;
  FlagSaver local_2060;
  string local_2058;
  string local_2038 [255];
  undefined1 local_39;
  
  FlagSaver::FlagSaver(&local_2060);
  __s = (string *)&stderr;
  fprintf(_stderr,"Running test %s/%s\n","DeprecatedFunctionsTest","AppendFlagsIntoFile");
  fLI::FLAGS_test_int32 = 10;
  local_2038[0].field_2._M_allocated_capacity = 0x656c696667616c66;
  local_2038[0]._M_string_length = 8;
  local_2038[0].field_2._M_local_buf[8] = '\0';
  local_2038[0]._M_dataplus._M_p = (pointer)&local_2038[0].field_2;
  TmpFile(&local_2058,local_2038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2038[0]._M_dataplus._M_p != &local_2038[0].field_2) {
    operator_delete(local_2038[0]._M_dataplus._M_p);
  }
  unlink(local_2058._M_dataplus._M_p);
  bVar5 = AppendFlagsIntoFile(&local_2058,"not the real argv0");
  if (bVar5) {
    __stream = fopen(local_2058._M_dataplus._M_p,"r");
    if (__stream == (FILE *)0x0) goto LAB_001398ca;
    this = local_2038;
    pcVar6 = fgets((char *)this,0x1fff,__stream);
    if (pcVar6 == (char *)0x0) goto LAB_001398dc;
    auVar11[0] = -((char)local_2038[0].field_2._M_allocated_capacity == 'v');
    auVar11[1] = -((char)((ulong)local_2038[0].field_2._0_8_ >> 8) == '0');
    auVar11[2] = -((char)((ulong)local_2038[0].field_2._0_8_ >> 0x10) == '\n');
    auVar11[3] = -((char)((ulong)local_2038[0].field_2._0_8_ >> 0x18) == '\0');
    auVar11[4] = 0xff;
    auVar11[5] = 0xff;
    auVar11[6] = 0xff;
    auVar11[7] = 0xff;
    auVar11[8] = 0xff;
    auVar11[9] = 0xff;
    auVar11[10] = 0xff;
    auVar11[0xb] = 0xff;
    auVar11[0xc] = 0xff;
    auVar11[0xd] = 0xff;
    auVar11[0xe] = 0xff;
    auVar11[0xf] = 0xff;
    auVar9[0] = -((char)local_2038[0]._M_dataplus._M_p == 'n');
    auVar9[1] = -(local_2038[0]._M_dataplus._M_p._1_1_ == 'o');
    auVar9[2] = -(local_2038[0]._M_dataplus._M_p._2_1_ == 't');
    auVar9[3] = -(local_2038[0]._M_dataplus._M_p._3_1_ == ' ');
    auVar9[4] = -(local_2038[0]._M_dataplus._M_p._4_1_ == 't');
    auVar9[5] = -(local_2038[0]._M_dataplus._M_p._5_1_ == 'h');
    auVar9[6] = -(local_2038[0]._M_dataplus._M_p._6_1_ == 'e');
    auVar9[7] = -(local_2038[0]._M_dataplus._M_p._7_1_ == ' ');
    auVar9[8] = -((char)local_2038[0]._M_string_length == 'r');
    auVar9[9] = -(local_2038[0]._M_string_length._1_1_ == 'e');
    auVar9[10] = -(local_2038[0]._M_string_length._2_1_ == 'a');
    auVar9[0xb] = -(local_2038[0]._M_string_length._3_1_ == 'l');
    auVar9[0xc] = -(local_2038[0]._M_string_length._4_1_ == ' ');
    auVar9[0xd] = -(local_2038[0]._M_string_length._5_1_ == 'a');
    auVar9[0xe] = -(local_2038[0]._M_string_length._6_1_ == 'r');
    auVar9[0xf] = -(local_2038[0]._M_string_length._7_1_ == 'g');
    auVar9 = auVar9 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001398e1;
    pcVar6 = fgets((char *)local_2038,0x1fff,__stream);
    if (pcVar6 == (char *)0x0) {
LAB_001398c0:
      _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
      goto LAB_001398c5;
    }
    __s = local_2038;
    bVar3 = 0;
    bVar4 = 0;
    do {
      bVar2 = bVar4;
      bVar1 = bVar3;
      local_39 = 0;
      auVar10[0] = -(local_2038[0]._M_dataplus._M_p._3_1_ == 'e');
      auVar10[1] = -(local_2038[0]._M_dataplus._M_p._4_1_ == 's');
      auVar10[2] = -(local_2038[0]._M_dataplus._M_p._5_1_ == 't');
      auVar10[3] = -(local_2038[0]._M_dataplus._M_p._6_1_ == '_');
      auVar10[4] = -(local_2038[0]._M_dataplus._M_p._7_1_ == 'b');
      auVar10[5] = -((char)local_2038[0]._M_string_length == 'o');
      auVar10[6] = -(local_2038[0]._M_string_length._1_1_ == 'o');
      auVar10[7] = -(local_2038[0]._M_string_length._2_1_ == 'l');
      auVar10[8] = -(local_2038[0]._M_string_length._3_1_ == '=');
      auVar10[9] = -(local_2038[0]._M_string_length._4_1_ == 'f');
      auVar10[10] = -(local_2038[0]._M_string_length._5_1_ == 'a');
      auVar10[0xb] = -(local_2038[0]._M_string_length._6_1_ == 'l');
      auVar10[0xc] = -(local_2038[0]._M_string_length._7_1_ == 's');
      auVar10[0xd] = -(local_2038[0].field_2._M_local_buf[0] == 'e');
      auVar10[0xe] = -(local_2038[0].field_2._M_local_buf[1] == '\n');
      auVar10[0xf] = -(local_2038[0].field_2._M_local_buf[2] == '\0');
      auVar12[0] = -((char)local_2038[0]._M_dataplus._M_p == '-');
      auVar12[1] = -(local_2038[0]._M_dataplus._M_p._1_1_ == '-');
      auVar12[2] = -(local_2038[0]._M_dataplus._M_p._2_1_ == 't');
      auVar12[3] = -(local_2038[0]._M_dataplus._M_p._3_1_ == 'e');
      auVar12[4] = -(local_2038[0]._M_dataplus._M_p._4_1_ == 's');
      auVar12[5] = -(local_2038[0]._M_dataplus._M_p._5_1_ == 't');
      auVar12[6] = -(local_2038[0]._M_dataplus._M_p._6_1_ == '_');
      auVar12[7] = -(local_2038[0]._M_dataplus._M_p._7_1_ == 'b');
      auVar12[8] = -((char)local_2038[0]._M_string_length == 'o');
      auVar12[9] = -(local_2038[0]._M_string_length._1_1_ == 'o');
      auVar12[10] = -(local_2038[0]._M_string_length._2_1_ == 'l');
      auVar12[0xb] = -(local_2038[0]._M_string_length._3_1_ == '=');
      auVar12[0xc] = -(local_2038[0]._M_string_length._4_1_ == 'f');
      auVar12[0xd] = -(local_2038[0]._M_string_length._5_1_ == 'a');
      auVar12[0xe] = -(local_2038[0]._M_string_length._6_1_ == 'l');
      auVar12[0xf] = -(local_2038[0]._M_string_length._7_1_ == 's');
      auVar12 = auVar12 & auVar10;
      bVar5 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
      bVar8 = (local_2038[0].field_2._M_local_buf[0] == '\0' &&
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2038[0]._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x695f747365742d2d) && local_2038[0]._M_string_length == 0xa30313d3233746e;
      this = __s;
      pcVar6 = fgets((char *)__s,0x1fff,__stream);
      bVar3 = bVar1 | bVar8;
      bVar4 = bVar2 | bVar5;
    } while (pcVar6 != (char *)0x0);
    if (!(bool)(bVar1 | bVar8)) goto LAB_001398c0;
    if ((bool)(bVar2 | bVar5)) {
      fclose(__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2058._M_dataplus._M_p != &local_2058.field_2) {
        operator_delete(local_2058._M_dataplus._M_p);
      }
      FlagSaver::~FlagSaver(&local_2060);
      return;
    }
  }
  else {
LAB_001398c5:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_001398ca:
    piVar7 = __errno_location();
    this = (string *)(__s->_M_dataplus)._M_p;
    if (*piVar7 != 0) goto LAB_001398eb;
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run
              ((Test_DeprecatedFunctionsTest_AppendFlagsIntoFile *)this);
LAB_001398dc:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_001398e1:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
  }
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_001398eb:
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run
            ((Test_DeprecatedFunctionsTest_AppendFlagsIntoFile *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2058._M_dataplus._M_p != &local_2058.field_2) {
    operator_delete(local_2058._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&local_2060);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(DeprecatedFunctionsTest, AppendFlagsIntoFile) {
  FLAGS_test_int32 = 10;     // just to make the test more interesting
  string filename(TmpFile("flagfile"));
  unlink(filename.c_str());  // just to be safe
  const bool r = AppendFlagsIntoFile(filename, "not the real argv0");
  EXPECT_TRUE(r);

  FILE* fp;
  EXPECT_EQ(0, SafeFOpen(&fp, filename.c_str(), "r"));
  EXPECT_TRUE(fp != NULL);
  char line[8192];
  EXPECT_TRUE(fgets(line, sizeof(line)-1, fp) != NULL);  // get the first line
  // First line should be progname.
  EXPECT_STREQ("not the real argv0\n", line);

  bool found_bool = false, found_int32 = false;
  while (fgets(line, sizeof(line)-1, fp)) {
    line[sizeof(line)-1] = '\0';    // just to be safe
    if (strcmp(line, "--test_bool=false\n") == 0)
      found_bool = true;
    if (strcmp(line, "--test_int32=10\n") == 0)
      found_int32 = true;
  }
  EXPECT_TRUE(found_int32);
  EXPECT_TRUE(found_bool);
  fclose(fp);
}